

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O0

void Assimp::BaseImporter::ConvertToUTF8(vector<char,_std::allocator<char>_> *data)

{
  vector<char,_std::allocator<char>_> *this;
  size_type sVar1;
  DeadlyImportError *this_00;
  reference pvVar2;
  Logger *pLVar3;
  iterator iVar4;
  iterator iVar5;
  int *piVar6;
  back_insert_iterator<std::vector<char,_std::allocator<char>_>_> result;
  short *psVar7;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> result_00;
  undefined1 local_e0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> output_1;
  uint16_t *end_2;
  uint16_t *p_1;
  int *end_1;
  int *ptr;
  vector<char,_std::allocator<char>_> output;
  uint32_t *end;
  uint32_t *p;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_58;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_50;
  undefined1 local_45;
  allocator local_31;
  string local_30;
  vector<char,_std::allocator<char>_> *local_10;
  vector<char,_std::allocator<char>_> *data_local;
  
  local_10 = data;
  sVar1 = std::vector<char,_std::allocator<char>_>::size(data);
  if (7 < sVar1) {
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](local_10,0);
    if (((*pvVar2 == -0x11) &&
        (pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](local_10,1), *pvVar2 == -0x45
        )) && (pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](local_10,2),
              *pvVar2 == -0x41)) {
      pLVar3 = DefaultLogger::get();
      Logger::debug(pLVar3,"Found UTF-8 BOM ...");
      local_58._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(local_10);
      local_50 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                 operator+(&local_58,3);
      iVar4 = std::vector<char,_std::allocator<char>_>::end(local_10);
      iVar5 = std::vector<char,_std::allocator<char>_>::begin(local_10);
      std::
      copy<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                (local_50,(__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                          iVar4._M_current,
                 (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                 iVar5._M_current);
      this = local_10;
      sVar1 = std::vector<char,_std::allocator<char>_>::size(local_10);
      std::vector<char,_std::allocator<char>_>::resize(this,sVar1 - 3);
    }
    else {
      piVar6 = (int *)std::vector<char,_std::allocator<char>_>::front(local_10);
      if (*piVar6 == -0x20000) {
        end = (uint32_t *)std::vector<char,_std::allocator<char>_>::front(local_10);
        output.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
             std::vector<char,_std::allocator<char>_>::back(local_10);
        for (; end <= (ulong)output.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_;
            end = end + 1) {
        }
      }
      piVar6 = (int *)std::vector<char,_std::allocator<char>_>::front(local_10);
      if (*piVar6 == 0xfffe) {
        pLVar3 = DefaultLogger::get();
        Logger::debug(pLVar3,"Found UTF-32 BOM ...");
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)&ptr);
        piVar6 = (int *)std::vector<char,_std::allocator<char>_>::operator[](local_10,0);
        sVar1 = std::vector<char,_std::allocator<char>_>::size(local_10);
        result = std::back_inserter<std::vector<char,std::allocator<char>>>
                           ((vector<char,_std::allocator<char>_> *)&ptr);
        utf8::utf32to8<std::back_insert_iterator<std::vector<char,std::allocator<char>>>,int*>
                  (piVar6,(int *)((long)piVar6 + (sVar1 & 0xfffffffffffffffc) + 4),result);
        std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)&ptr);
      }
      else {
        psVar7 = (short *)std::vector<char,_std::allocator<char>_>::front(local_10);
        if (*psVar7 == -2) {
          end_2 = (uint16_t *)std::vector<char,_std::allocator<char>_>::front(local_10);
          output_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)std::vector<char,_std::allocator<char>_>::back(local_10);
          for (; end_2 <= output_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage; end_2 = end_2 + 1) {
            ByteSwap::Swap2(end_2);
          }
        }
        psVar7 = (short *)std::vector<char,_std::allocator<char>_>::front(local_10);
        if (*psVar7 == -0x101) {
          pLVar3 = DefaultLogger::get();
          Logger::debug(pLVar3,"Found UTF-16 BOM ...");
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0);
          iVar4 = std::vector<char,_std::allocator<char>_>::begin(local_10);
          iVar5 = std::vector<char,_std::allocator<char>_>::end(local_10);
          result_00 = std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0);
          utf8::
          utf16to8<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                     iVar4._M_current,
                     (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                     iVar5._M_current,result_00);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0);
        }
      }
    }
    return;
  }
  local_45 = 1;
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"File is too small",&local_31);
  DeadlyImportError::DeadlyImportError(this_00,&local_30);
  local_45 = 0;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void BaseImporter::ConvertToUTF8(std::vector<char>& data)
{
    //ConversionResult result;
    if(data.size() < 8) {
        throw DeadlyImportError("File is too small");
    }

    // UTF 8 with BOM
    if((uint8_t)data[0] == 0xEF && (uint8_t)data[1] == 0xBB && (uint8_t)data[2] == 0xBF) {
        ASSIMP_LOG_DEBUG("Found UTF-8 BOM ...");

        std::copy(data.begin()+3,data.end(),data.begin());
        data.resize(data.size()-3);
        return;
    }
    
    
    // UTF 32 BE with BOM
    if(*((uint32_t*)&data.front()) == 0xFFFE0000) {

        // swap the endianness ..
        for(uint32_t* p = (uint32_t*)&data.front(), *end = (uint32_t*)&data.back(); p <= end; ++p) {
            AI_SWAP4P(p);
        }
    }

    // UTF 32 LE with BOM
    if(*((uint32_t*)&data.front()) == 0x0000FFFE) {
        ASSIMP_LOG_DEBUG("Found UTF-32 BOM ...");

        std::vector<char> output;
        int *ptr = (int*)&data[ 0 ];
        int *end = ptr + ( data.size() / sizeof(int) ) +1;
        utf8::utf32to8( ptr, end, back_inserter(output));
        return;
    }

    // UTF 16 BE with BOM
    if(*((uint16_t*)&data.front()) == 0xFFFE) {

        // swap the endianness ..
        for(uint16_t* p = (uint16_t*)&data.front(), *end = (uint16_t*)&data.back(); p <= end; ++p) {
            ByteSwap::Swap2(p);
        }
    }

    // UTF 16 LE with BOM
    if(*((uint16_t*)&data.front()) == 0xFEFF) {
        ASSIMP_LOG_DEBUG("Found UTF-16 BOM ...");

        std::vector<unsigned char> output;
        utf8::utf16to8(data.begin(), data.end(), back_inserter(output));
        return;
    }
}